

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  Reactor *reactor_00;
  ostream *this;
  exception *e;
  string local_148;
  undefined1 local_128 [8];
  FileInputSource is;
  shared_ptr<(anonymous_namespace)::Reactor> local_40;
  undefined1 local_30 [8];
  shared_ptr<(anonymous_namespace)::Reactor> reactor;
  char *filename;
  char **argv_local;
  int argc_local;
  
  if ((argc < 2) || (3 < argc)) {
    usage();
    argv_local._4_4_ = 2;
  }
  else {
    reactor.super___shared_ptr<(anonymous_namespace)::Reactor,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv[1];
    std::shared_ptr<(anonymous_namespace)::Reactor>::shared_ptr
              ((shared_ptr<(anonymous_namespace)::Reactor> *)local_30);
    if (argc == 3) {
      iVar1 = strcmp(argv[2],"--react");
      if (iVar1 == 0) {
        std::make_shared<(anonymous_namespace)::Reactor>();
        std::shared_ptr<(anonymous_namespace)::Reactor>::operator=
                  ((shared_ptr<(anonymous_namespace)::Reactor> *)local_30,&local_40);
        std::shared_ptr<(anonymous_namespace)::Reactor>::~shared_ptr(&local_40);
      }
      else {
        usage();
      }
    }
    FileInputSource::FileInputSource
              ((FileInputSource *)local_128,
               (char *)reactor.
                       super___shared_ptr<(anonymous_namespace)::Reactor,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
    reactor_00 = &std::__shared_ptr<(anonymous_namespace)::Reactor,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<(anonymous_namespace)::Reactor,_(__gnu_cxx::_Lock_policy)2>
                              *)local_30)->super_Reactor;
    JSON::parse((JSON *)&e,(InputSource *)local_128,reactor_00);
    JSON::unparse_abi_cxx11_(&local_148,(JSON *)&e);
    this = std::operator<<((ostream *)&std::cout,(string *)&local_148);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_148);
    JSON::~JSON((JSON *)&e);
    FileInputSource::~FileInputSource((FileInputSource *)local_128);
    argv_local._4_4_ = 0;
    std::shared_ptr<(anonymous_namespace)::Reactor>::~shared_ptr
              ((shared_ptr<(anonymous_namespace)::Reactor> *)local_30);
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((argc < 2) || (argc > 3)) {
        usage();
        return 2;
    }
    char const* filename = argv[1];
    std::shared_ptr<Reactor> reactor;
    if (argc == 3) {
        if (strcmp(argv[2], "--react") == 0) {
            reactor = std::make_shared<Reactor>();
        } else {
            usage();
        }
    }
    try {
        FileInputSource is(filename);
        std::cout << JSON::parse(is, reactor.get()).unparse() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << filename << ": " << e.what() << std::endl;
        return 2;
    }
    return 0;
}